

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

void __thiscall cfd::capi::CfdCapiManager::FreeHandle(CfdCapiManager *this,void *handle)

{
  mutex *__mutex;
  pointer *pppCVar1;
  pointer __dest;
  CfdCapiHandleData *__ptr;
  int iVar2;
  pointer ppCVar3;
  CfdException *this_00;
  undefined8 uVar4;
  pointer __src;
  CfdCapiHandleData *local_50;
  undefined1 local_48 [32];
  
  if (handle != (void *)0x0) {
    local_50 = (CfdCapiHandleData *)handle;
    if (*(long *)((long)handle + 7) != 0x61746144656c64 || *handle != 0x646e614869706143) {
      local_48._0_8_ = "cfdcapi_common.cpp";
      local_48._8_4_ = 0x164;
      local_48._16_8_ = "FreeHandle";
      core::logger::log<>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
                          "Illegal handle data. prefix unmatch.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Illegal handle data.","");
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (*(char *)((long)handle + 0x14) == '\x01') {
      memset(handle,0,0x118);
      free(handle);
      return;
    }
    __mutex = &this->mutex_;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    ppCVar3 = (this->handle_list_).
              super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __dest = ppCVar3;
    for (; ppCVar3 !=
           (this->handle_list_).
           super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
      __src = __dest + 1;
      if (local_50 == *ppCVar3) {
        local_48._0_8_ = "cfdcapi_common.cpp";
        local_48._8_4_ = 0x173;
        local_48._16_8_ = "FreeHandle";
        core::logger::log<void*&>
                  ((CfdSourceLocation *)local_48,kCfdLogLevelInfo,"capi FreeHandle. addr={:p}.",
                   &local_50);
        __ptr = local_50;
        memset(local_50,0,0x118);
        free(__ptr);
        ppCVar3 = (this->handle_list_).
                  super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppCVar3) {
          memmove(__dest,__src,(long)ppCVar3 - (long)__src);
        }
        pppCVar1 = &(this->handle_list_).
                    super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + -1;
        break;
      }
      __dest = __src;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CfdCapiManager::FreeHandle(void* handle) {
  if (handle != nullptr) {
    CfdCapiHandleData* handle_data = static_cast<CfdCapiHandleData*>(handle);
    size_t len = strlen(kPrefixHandleData) + 1;
    if (memcmp(handle_data->prefix, kPrefixHandleData, len) != 0) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (handle_data->is_outside) {  // outside handle
      memset(handle, 0, sizeof(CfdCapiHandleData));
      ::free(handle);
    } else {
      // 排他制御開始
      std::lock_guard<std::mutex> lock(mutex_);

      std::vector<CfdCapiHandleData*>::iterator ite;
      for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
        if (handle == *ite) {
          info(CFD_LOG_SOURCE, "capi FreeHandle. addr={:p}.", handle);
          memset(handle, 0, sizeof(CfdCapiHandleData));
          ::free(handle);
          handle_list_.erase(ite);
          break;
        }
      }
    }
  }
}